

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int mbedtls_sha512_ret(uchar *input,size_t ilen,uchar *output,int is384)

{
  undefined1 local_100 [8];
  mbedtls_sha512_context ctx;
  int ret;
  int is384_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.is384 = -0x6e;
  ctx._212_4_ = is384;
  mbedtls_sha512_init((mbedtls_sha512_context *)local_100);
  ctx.is384 = mbedtls_sha512_starts_ret((mbedtls_sha512_context *)local_100,ctx._212_4_);
  if ((ctx.is384 == 0) &&
     (ctx.is384 = mbedtls_sha512_update_ret((mbedtls_sha512_context *)local_100,input,ilen),
     ctx.is384 == 0)) {
    ctx.is384 = mbedtls_sha512_finish_ret((mbedtls_sha512_context *)local_100,output);
  }
  mbedtls_sha512_free((mbedtls_sha512_context *)local_100);
  return ctx.is384;
}

Assistant:

int mbedtls_sha512_ret( const unsigned char *input,
                    size_t ilen,
                    unsigned char output[64],
                    int is384 )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_sha512_context ctx;

#if !defined(MBEDTLS_SHA512_NO_SHA384)
    SHA512_VALIDATE_RET( is384 == 0 || is384 == 1 );
#else
    SHA512_VALIDATE_RET( is384 == 0 );
#endif
    SHA512_VALIDATE_RET( ilen == 0 || input != NULL );
    SHA512_VALIDATE_RET( (unsigned char *)output != NULL );

    mbedtls_sha512_init( &ctx );

    if( ( ret = mbedtls_sha512_starts_ret( &ctx, is384 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha512_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha512_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_sha512_free( &ctx );

    return( ret );
}